

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  uint32_t uVar1;
  int iVar2;
  MessageLite *pMVar3;
  LogMessage *other;
  Message **ppMVar4;
  undefined4 extraout_var;
  Message *pMVar5;
  undefined4 extraout_var_00;
  OneofDescriptor *oneof_descriptor;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  FieldDescriptor *local_70;
  code *local_68 [7];
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_68[0] = FieldDescriptor::TypeOnceInit;
    local_70 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),local_68,&local_70);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (((byte)field[1] & 8) == 0) {
    uVar1 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    ppMVar4 = (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1);
    uVar6 = *(ulong *)(field + 0x28);
    if ((uVar6 == 0 || ((byte)field[1] & 0x10) == 0) ||
       ((*(int *)(uVar6 + 4) == 1 && ((*(byte *)(*(long *)(uVar6 + 0x20) + 1) & 2) != 0)))) {
      SetBit(this,message,field);
    }
    else {
      uVar8 = 0;
      if (((byte)field[1] & 0x10) == 0) {
        uVar6 = uVar8;
      }
      if (*(int *)(uVar6 + 4) == 1) {
        uVar8 = (ulong)((*(byte *)(*(long *)(uVar6 + 0x20) + 1) & 2) >> 1);
      }
      if ((char)uVar8 != '\0') {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                   ,0x5b7);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_68,
                           "CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
        if ((char)uVar8 != '\0') {
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
      }
      if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)(uVar6 - *(long *)(*(long *)(uVar6 + 0x10) + 0x30) >> 3) *
                                0x33333334 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field + 4)) {
        if (((byte)field[1] & 0x10) == 0) {
          oneof_descriptor = (OneofDescriptor *)0x0;
        }
        else {
          oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
        }
        ClearOneof(this,message,oneof_descriptor);
        ppMVar4 = MutableField<google::protobuf::Message*>(this,message,field);
        pMVar5 = GetDefaultMessageInstance(this,field);
        uVar6 = (message->super_MessageLite)._internal_metadata_.ptr_;
        puVar7 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
        if ((uVar6 & 1) != 0) {
          puVar7 = (undefined8 *)*puVar7;
        }
        iVar2 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5,puVar7);
        *ppMVar4 = (Message *)CONCAT44(extraout_var,iVar2);
      }
    }
    if (*ppMVar4 == (Message *)0x0) {
      pMVar5 = GetDefaultMessageInstance(this,field);
      uVar6 = (message->super_MessageLite)._internal_metadata_.ptr_;
      puVar7 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        puVar7 = (undefined8 *)*puVar7;
      }
      iVar2 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5,puVar7);
      *ppMVar4 = (Message *)CONCAT44(extraout_var_00,iVar2);
    }
    pMVar3 = &(*ppMVar4)->super_MessageLite;
  }
  else {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar1 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar3 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),field
                        ,factory);
  }
  return (Message *)pMVar3;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArenaForAllocation());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArenaForAllocation());
    }
    result = *result_holder;
    return result;
  }
}